

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_block_close(BigBlock *block)

{
  int iVar1;
  int local_14;
  int rt;
  BigBlock *block_local;
  
  local_14 = 0;
  iVar1 = big_block_flush(block);
  if (iVar1 != 0) {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x282);
    local_14 = -1;
  }
  _big_block_close_internal(block);
  return local_14;
}

Assistant:

int
big_block_close(BigBlock * block)
{
    int rt = 0;
    RAISEIF(0 != big_block_flush(block),
            ex_flush,
            NULL);
finalize:
    _big_block_close_internal(block);
    return rt;

ex_flush:
    rt = -1;
    goto finalize;
}